

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_image.cpp
# Opt level: O0

void __thiscall
Bitmap_Operation::BitmapInfoHeader::set
          (BitmapInfoHeader *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  size_t offset;
  size_t *in_stack_ffffffffffffffd8;
  
  get_value<unsigned_int>(in_RDI,in_stack_ffffffffffffffd8,(uint *)0x130a24);
  get_value<int>(in_RDI,in_stack_ffffffffffffffd8,(int *)0x130a3c);
  get_value<int>(in_RDI,in_stack_ffffffffffffffd8,(int *)0x130a54);
  get_value<unsigned_short>(in_RDI,in_stack_ffffffffffffffd8,(unsigned_short *)0x130a6c);
  get_value<unsigned_short>(in_RDI,in_stack_ffffffffffffffd8,(unsigned_short *)0x130a84);
  get_value<unsigned_int>(in_RDI,in_stack_ffffffffffffffd8,(uint *)0x130a9c);
  get_value<unsigned_int>(in_RDI,in_stack_ffffffffffffffd8,(uint *)0x130ab4);
  get_value<int>(in_RDI,in_stack_ffffffffffffffd8,(int *)0x130acc);
  get_value<int>(in_RDI,in_stack_ffffffffffffffd8,(int *)0x130ae4);
  get_value<unsigned_int>(in_RDI,in_stack_ffffffffffffffd8,(uint *)0x130afc);
  get_value<unsigned_int>(in_RDI,in_stack_ffffffffffffffd8,(uint *)0x130b14);
  return;
}

Assistant:

void set( const std::vector < uint8_t > & data )
        {
            size_t offset = 0;
            get_value( data, offset, biSize );
            get_value( data, offset, biWidth );
            get_value( data, offset, biHeight );
            get_value( data, offset, biPlanes );
            get_value( data, offset, biBitCount );
            get_value( data, offset, biCompress );
            get_value( data, offset, biSizeImage );
            get_value( data, offset, biXPelsPerMeter );
            get_value( data, offset, biYPelsPerMeter );
            get_value( data, offset, biClrUsed );
            get_value( data, offset, biClrImportant );
        }